

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O2

int xmlStrVASPrintf(xmlChar **out,int maxSize,char *msg,__va_list_tag *ap)

{
  uint uVar1;
  int iVar2;
  xmlChar *__s;
  ulong uVar3;
  size_t __maxlen;
  uint uVar4;
  ulong uVar5;
  char empty [1];
  va_list copy;
  
  iVar2 = 1;
  if ((out != (xmlChar **)0x0) && (*out = (xmlChar *)0x0, msg != (char *)0x0)) {
    uVar5 = (ulong)(uint)maxSize;
    if (maxSize < 0x21) {
      uVar5 = 0x20;
    }
    copy[0].reg_save_area = ap->reg_save_area;
    copy[0].gp_offset = ap->gp_offset;
    copy[0].fp_offset = ap->fp_offset;
    copy[0].overflow_arg_area = ap->overflow_arg_area;
    uVar1 = vsnprintf(empty,1,msg,copy);
    uVar4 = (uint)uVar5;
    if ((int)uVar1 < 1) {
      __maxlen = 0x20;
      while (__s = (xmlChar *)(*xmlMalloc)(__maxlen), __s != (xmlChar *)0x0) {
        copy[0].reg_save_area = ap->reg_save_area;
        copy[0].gp_offset = ap->gp_offset;
        copy[0].fp_offset = ap->fp_offset;
        copy[0].overflow_arg_area = ap->overflow_arg_area;
        iVar2 = vsnprintf((char *)__s,__maxlen,msg,copy);
        uVar1 = (uint)__maxlen;
        uVar3 = (ulong)(uVar1 - 1);
        if (-1 < iVar2 && iVar2 < (int)(uVar1 - 1)) goto LAB_0015b9b1;
        if (uVar4 <= uVar1) {
          uVar5 = uVar3;
          if (1 < (int)uVar1) goto LAB_0015ba5c;
          goto LAB_0015ba7e;
        }
        (*xmlFree)(__s);
        __maxlen = (ulong)(uVar1 * 2);
        if ((uint)(uVar5 >> 1) < uVar1) {
          __maxlen = uVar5;
        }
      }
    }
    else {
      uVar3 = (ulong)(uVar1 + 1);
      if (uVar4 <= uVar1) {
        uVar3 = uVar5;
      }
      __s = (xmlChar *)(*xmlMalloc)(uVar3);
      if (__s != (xmlChar *)0x0) {
        iVar2 = vsnprintf((char *)__s,uVar3,msg,ap);
        if (iVar2 < 0) {
          (*xmlFree)(__s);
          return 1;
        }
        if (uVar1 < uVar4) {
LAB_0015b9b1:
          iVar2 = 0;
        }
        else {
          uVar3 = (ulong)(uVar4 - 1);
LAB_0015ba5c:
          do {
            iVar2 = (int)uVar3;
            uVar5 = uVar3;
            if ((-1 < (char)__s[iVar2 - 1]) || (uVar5 = uVar3 - 1, uVar3 < 2)) break;
            uVar3 = uVar5;
          } while (__s[iVar2 - 1] < 0xc0);
LAB_0015ba7e:
          __s[(int)uVar5] = '\0';
          iVar2 = 1;
        }
        *out = __s;
        return iVar2;
      }
    }
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int
xmlStrVASPrintf(xmlChar **out, int maxSize, const char *msg, va_list ap) {
    char empty[1];
    va_list copy;
    xmlChar *buf;
    int res, size;
    int truncated = 0;

    if (out == NULL)
        return(1);
    *out = NULL;
    if (msg == NULL)
        return(1);
    if (maxSize < 32)
        maxSize = 32;

    va_copy(copy, ap);
    res = vsnprintf(empty, 1, msg, copy);
    va_end(copy);

    if (res > 0) {
        /* snprintf seems to work according to C99. */

        if (res < maxSize) {
            size = res + 1;
        } else {
            size = maxSize;
            truncated = 1;
        }
        buf = xmlMalloc(size);
        if (buf == NULL)
            return(-1);
        if (vsnprintf((char *) buf, size, msg, ap) < 0) {
            xmlFree(buf);
            return(1);
        }
    } else {
        /*
         * Unfortunately, older snprintf implementations don't follow the
         * C99 spec. If the output exceeds the size of the buffer, they can
         * return -1, 0 or the number of characters written instead of the
         * needed size. Older MSCVRT also won't write a terminating null
         * byte if the buffer is too small.
         *
         * If the value returned is non-negative and strictly less than
         * the buffer size (without terminating null), the result should
         * have been written completely, so we double the buffer size
         * until this condition is true. This assumes that snprintf will
         * eventually return a non-negative value. Otherwise, we will
         * allocate more and more memory until we run out.
         *
         * Note that this code path is also executed on conforming
         * platforms if the output is the empty string.
         */

        buf = NULL;
        size = 32;
        while (1) {
            buf = xmlMalloc(size);
            if (buf == NULL)
                return(-1);

            va_copy(copy, ap);
            res = vsnprintf((char *) buf, size, msg, copy);
            va_end(copy);
            if ((res >= 0) && (res < size - 1))
                break;

            if (size >= maxSize) {
                truncated = 1;
                break;
            }

            xmlFree(buf);

            if (size > maxSize / 2)
                size = maxSize;
            else
                size *= 2;
        }
    }

    /*
     * If the output was truncated, make sure that the buffer doesn't
     * end with a truncated UTF-8 sequence.
     */
    if (truncated != 0) {
        int i = size - 1;

        while (i > 0) {
            /* Break after ASCII */
            if (buf[i-1] < 0x80)
                break;
            i -= 1;
            /* Break before non-ASCII */
            if (buf[i] >= 0xc0)
                break;
        }

        buf[i] = 0;
    }

    *out = (xmlChar *) buf;
    return(truncated);
}